

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-literal.cc
# Opt level: O3

void anon_unknown.dwarf_b4209::AssertUint64Fails(char *s)

{
  long lVar1;
  bool bVar2;
  size_t sVar3;
  char *message;
  AssertionResult gtest_ar;
  uint64_t actual_bits;
  Message local_40;
  AssertHelper local_38;
  internal local_30 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  uint64_t local_20;
  
  local_40.ss_.ptr_._0_4_ = 1;
  sVar3 = strlen(s);
  local_38.data_._0_4_ = wabt::ParseUint64(s,s + sVar3,&local_20);
  testing::internal::CmpHelperEQ<wabt::Result::Enum,wabt::Result>
            (local_30,"Result::Error","ParseUint64(s, s + strlen(s), &actual_bits)",
             (Enum *)&local_40,(Result *)&local_38);
  if (local_30[0] == (internal)0x0) {
    testing::Message::Message(&local_40);
    lVar1 = CONCAT44(local_40.ss_.ptr_._4_4_,local_40.ss_.ptr_._0_4_);
    if (s == (char *)0x0) {
      s = "(null)";
      sVar3 = 6;
    }
    else {
      sVar3 = strlen(s);
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)(lVar1 + 0x10),s,sVar3);
    if (local_28.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = ((local_28.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_38,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-literal.cc"
               ,0x96,message);
    testing::internal::AssertHelper::operator=(&local_38,&local_40);
    testing::internal::AssertHelper::~AssertHelper(&local_38);
    if (CONCAT44(local_40.ss_.ptr_._4_4_,local_40.ss_.ptr_._0_4_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_40.ss_.ptr_._4_4_,local_40.ss_.ptr_._0_4_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_40.ss_.ptr_._4_4_,local_40.ss_.ptr_._0_4_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_28,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  return;
}

Assistant:

void AssertUint64Fails(const char* s) {
  uint64_t actual_bits;
  ASSERT_EQ(Result::Error, ParseUint64(s, s + strlen(s), &actual_bits)) << s;
}